

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

int soplex::orderOfMagnitude(Rational *r)

{
  bool bVar1;
  double dVar2;
  undefined8 uVar3;
  uint uVar4;
  Rational *pRVar5;
  undefined8 __dest;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double result_2;
  double result;
  double result_1;
  data_type local_a8;
  uint local_98;
  byte local_94;
  byte local_93;
  byte local_92;
  data_type local_88;
  uint local_78;
  undefined1 local_74;
  byte local_73;
  byte local_72;
  undefined1 local_68 [16];
  data_type local_58;
  uint local_48;
  undefined1 local_44;
  byte local_43;
  byte local_42;
  double local_38;
  double local_30;
  
  uVar3 = &local_a8;
  local_a8.la[0] = 0;
  local_92 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar4 = (r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_98 = 0;
  if ((bool)local_92 != false) {
    local_98 = uVar4;
  }
  local_94 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_sign;
  local_93 = local_92 ^ 1;
  if ((bool)local_92 == true) {
    local_a8.la[0] =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_a8.ld.data =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_a8.ld,uVar4,uVar4);
    __dest = &local_a8;
    if (local_93 == 0) {
      __dest = local_a8.ld.data;
    }
    pRVar5 = r;
    if ((r->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      pRVar5 = (Rational *)
               (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_data.ld.data;
    }
    memcpy((void *)__dest,pRVar5,
           (ulong)(r->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
    uVar4 = local_98;
  }
  if (((local_94 & 1) == 0) && (uVar4 == 1)) {
    if (local_93 == 0) {
      uVar3 = local_a8.ld.data;
    }
    if (*(unsigned_long_long *)uVar3 == 0) {
      bVar1 = true;
      goto LAB_0032068c;
    }
  }
  local_88.la[0] = 0;
  local_72 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar4 = (r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_78 = 0;
  if ((bool)local_72 != false) {
    local_78 = uVar4;
  }
  local_74 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_sign;
  local_73 = local_72 ^ 1;
  if ((bool)local_72 == true) {
    local_88.la[0] =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_88.ld.data =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_88.ld,uVar4,uVar4);
    uVar3 = &local_88;
    if (local_73 == 0) {
      uVar3 = local_88.ld.data;
    }
    pRVar5 = r;
    if ((r->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      pRVar5 = (Rational *)
               (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_data.ld.data;
    }
    memcpy((void *)uVar3,pRVar5,
           (ulong)(r->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  local_58.la[0] = 0;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::convert_to_imp<double>
            ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&local_88.ld,(double *)local_58.la);
  dVar2 = log10((double)local_58.la[0]);
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_8_ = dVar2;
  local_68._12_4_ = extraout_XMM0_Dd;
  pnVar6 = &(r->m_backend).m_value.den;
  local_58.la[0] = 0;
  local_42 = (r->m_backend).m_value.den.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar4 = (r->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_48 = 0;
  if ((bool)local_42 != false) {
    local_48 = uVar4;
  }
  local_44 = (r->m_backend).m_value.den.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_sign;
  local_43 = local_42 ^ 1;
  if ((bool)local_42 == true) {
    local_58.la[0] =
         (pnVar6->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_58.ld.data =
         (r->m_backend).m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_58.ld,uVar4,uVar4);
    uVar3 = &local_58;
    if (local_43 == 0) {
      uVar3 = local_58.ld.data;
    }
    if ((r->m_backend).m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      pnVar6 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)(r->m_backend).m_value.den.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_data.ld.data;
    }
    memcpy((void *)uVar3,pnVar6,
           (ulong)(r->m_backend).m_value.den.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  iVar8 = (int)(double)local_68._8_8_;
  local_68._8_4_ = SUB84((double)iVar8,0);
  local_68._0_8_ = (double)(int)(double)local_68._0_8_;
  local_68._12_4_ = (int)((ulong)(double)iVar8 >> 0x20);
  local_30 = 0.0;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::convert_to_imp<double>
            ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
              *)&local_58.ld,&local_30);
  dVar2 = log10(local_30);
  bVar1 = dVar2 == (double)local_68._0_8_;
  if ((local_43 == 0) && (local_42 == 0)) {
    operator_delete(local_58.ld.data,(local_58.la[0] & 0xffffffff) << 3);
  }
  if ((local_73 == 0) && (local_72 == 0)) {
    operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
  }
LAB_0032068c:
  if (((local_93 & 1) == 0) && (local_92 == 0)) {
    operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
  }
  iVar8 = 0;
  if (!bVar1) {
    local_a8.la[0] = 0;
    local_92 = (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_alias;
    uVar4 = (r->m_backend).m_value.num.m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs;
    local_98 = 0;
    if ((bool)local_92 != false) {
      local_98 = uVar4;
    }
    local_94 = (r->m_backend).m_value.num.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_sign;
    local_93 = local_92 ^ 1;
    if ((bool)local_92 == true) {
      local_a8.la[0] =
           (r->m_backend).m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0];
      local_a8.ld.data =
           (r->m_backend).m_value.num.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    else {
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_a8.ld,uVar4,uVar4);
      uVar3 = &local_a8;
      if (local_93 == 0) {
        uVar3 = local_a8.ld.data;
      }
      pRVar5 = r;
      if ((r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        pRVar5 = (Rational *)
                 (r->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.ld.data;
      }
      memcpy((void *)uVar3,pRVar5,
             (ulong)(r->m_backend).m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    local_88.la[0] = 0;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::convert_to_imp<double>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&local_a8.ld,(double *)local_88.la);
    dVar2 = log10((double)local_88.la[0]);
    local_68._0_8_ = dVar2;
    pnVar6 = &(r->m_backend).m_value.den;
    local_88.la[0] = 0;
    local_72 = (r->m_backend).m_value.den.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_alias;
    uVar4 = (r->m_backend).m_value.den.m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs;
    local_78 = 0;
    if ((bool)local_72 != false) {
      local_78 = uVar4;
    }
    local_74 = (r->m_backend).m_value.den.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_sign;
    local_73 = local_72 ^ 1;
    if ((bool)local_72 == true) {
      local_88.la[0] =
           (pnVar6->m_backend).
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.la[0];
      local_88.ld.data =
           (r->m_backend).m_value.den.m_backend.
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    else {
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_88.ld,uVar4,uVar4);
      uVar3 = &local_88;
      if (local_73 == 0) {
        uVar3 = local_88.ld.data;
      }
      if ((r->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        pnVar6 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data;
      }
      memcpy((void *)uVar3,pnVar6,
             (ulong)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    local_58.la[0] = 0;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::convert_to_imp<double>
              ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)&local_88.ld,(double *)local_58.la);
    dVar2 = log10((double)local_58.la[0]);
    uVar7 = SUB84(dVar2,0);
    uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
    if ((local_73 == 0) && (local_72 == 0)) {
      local_38 = dVar2;
      operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
      uVar7 = SUB84(local_38,0);
      uVar9 = (undefined4)((ulong)local_38 >> 0x20);
    }
    iVar8 = (int)(double)local_68._0_8_;
    if ((local_93 == 0) && (local_92 == 0)) {
      operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
    }
    iVar8 = iVar8 - (int)(double)CONCAT44(uVar9,uVar7);
  }
  return iVar8;
}

Assistant:

inline int orderOfMagnitude(Rational& r)
{
   if(numerator(r) == 0 || (int) log10((double)numerator(r)) == log10((double)denominator(r)))
      return 0;
   else
      return (int) log10((double)numerator(r)) - (int) log10((double)denominator(r));
}